

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

string * __thiscall
cppurses::to_string_abi_cxx11_(string *__return_storage_ptr__,cppurses *this,Type type)

{
  char *pcVar1;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar1 = "MouseButtonPress";
    break;
  case 2:
    pcVar1 = "MouseButtonRelease";
    break;
  case 3:
    pcVar1 = "MouseButtonDblClick";
    break;
  case 4:
    pcVar1 = "MouseWheel";
    break;
  case 5:
    pcVar1 = "MouseMove";
    break;
  case 6:
    pcVar1 = "KeyPress";
    break;
  case 7:
    pcVar1 = "KeyRelease";
    break;
  case 8:
    pcVar1 = "FocusIn";
    break;
  case 9:
    pcVar1 = "FocusOut";
    break;
  case 10:
    pcVar1 = "Paint";
    break;
  case 0xb:
    pcVar1 = "Move";
    break;
  case 0xc:
    pcVar1 = "Resize";
    break;
  case 0xd:
    pcVar1 = "TerminalResize";
    break;
  case 0xe:
    pcVar1 = "ChildAdded";
    break;
  case 0xf:
    pcVar1 = "ChildRemoved";
    break;
  case 0x10:
    pcVar1 = "ChildPolished";
    break;
  case 0x11:
    pcVar1 = "Enable";
    break;
  case 0x12:
    pcVar1 = "Disable";
    break;
  case 0x13:
    pcVar1 = "Delete";
    break;
  case 0x14:
    pcVar1 = "Timer";
    break;
  case 0x15:
    pcVar1 = "Custom";
    break;
  default:
    pcVar1 = "None";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

auto to_string(Event::Type type) -> std::string
{
    switch (type) {
        case Event::MouseButtonPress: return "MouseButtonPress";
        case Event::MouseButtonRelease: return "MouseButtonRelease";
        case Event::MouseButtonDblClick: return "MouseButtonDblClick";
        case Event::MouseWheel: return "MouseWheel";
        case Event::MouseMove: return "MouseMove";
        case Event::KeyPress: return "KeyPress";
        case Event::KeyRelease: return "KeyRelease";
        case Event::FocusIn: return "FocusIn";
        case Event::FocusOut: return "FocusOut";
        case Event::Paint: return "Paint";
        case Event::Move: return "Move";
        case Event::Resize: return "Resize";
        case Event::TerminalResize: return "TerminalResize";
        case Event::ChildAdded: return "ChildAdded";
        case Event::ChildRemoved: return "ChildRemoved";
        case Event::ChildPolished: return "ChildPolished";
        case Event::Enable: return "Enable";
        case Event::Disable: return "Disable";
        case Event::Delete: return "Delete";
        case Event::Timer: return "Timer";
        case Event::Custom: return "Custom";
        default: return "None";
    }
}